

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3EndTable(Parse *pParse,Token *pCons,Token *pEnd,u32 tabOpts,Select *pSelect)

{
  i16 iVar1;
  sqlite3 *db_00;
  Table *pTab;
  int iVar2;
  int iVar3;
  uint uVar4;
  Column *pCVar5;
  char *pcVar6;
  Vdbe *p_00;
  Table *pTVar7;
  void *pvVar8;
  uint in_ECX;
  Token *in_RDX;
  Token *in_RSI;
  Parse *in_RDI;
  long in_R8;
  long in_FS_OFFSET;
  Schema *pSchema;
  Table *pOld;
  Db *pDb;
  Token *pEnd2;
  int iCsr;
  Table *pSelTab;
  int addrInsLoop;
  int regRowid;
  int regRec;
  int addrTop;
  int regYield;
  char *zStmt;
  char *zType2;
  char *zType;
  Vdbe *v;
  int n;
  Expr *pX;
  u32 colFlags;
  int nNG;
  int ii_1;
  Column *pCol;
  int ii;
  Index *pIdx;
  int iDb;
  sqlite3 *db;
  Table *p;
  undefined4 in_stack_00000128;
  SelectDest dest;
  int in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8c;
  u16 in_stack_fffffffffffffe8e;
  sqlite3 *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  int p1;
  int in_stack_fffffffffffffe9c;
  Parse *in_stack_fffffffffffffea0;
  Parse *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Token *in_stack_fffffffffffffeb8;
  Parse *in_stack_fffffffffffffec0;
  Table *in_stack_fffffffffffffec8;
  Table *in_stack_fffffffffffffed0;
  sqlite3 *in_stack_fffffffffffffed8;
  Table *in_stack_fffffffffffffef0;
  Parse *in_stack_fffffffffffffef8;
  sqlite3 *local_c8;
  char *pcVar9;
  char *pcVar10;
  int local_90;
  int local_8c;
  int local_7c;
  Index *local_78;
  Token *local_40;
  SelectDest local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  db_00 = in_RDI->db;
  if (((in_RDX == (Token *)0x0) && (in_R8 == 0)) || (pTab = in_RDI->pNewTable, pTab == (Table *)0x0)
     ) goto LAB_001add90;
  local_c8 = in_stack_fffffffffffffe90;
  if ((in_R8 == 0) &&
     (iVar2 = sqlite3ShadowTableName
                        ((sqlite3 *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                         (char *)in_stack_fffffffffffffe90), local_c8 = in_stack_fffffffffffffe90,
     iVar2 != 0)) {
    pTab->tabFlags = pTab->tabFlags | 0x1000;
  }
  if ((db_00->init).busy != '\0') {
    if ((in_R8 != 0) || ((pTab->eTabType != '\0' && ((db_00->init).newTnum != 0)))) {
      sqlite3ErrorMsg(in_RDI,"");
      goto LAB_001add90;
    }
    pTab->tnum = (db_00->init).newTnum;
    if (pTab->tnum == 1) {
      pTab->tabFlags = pTab->tabFlags | 1;
    }
  }
  if ((in_ECX & 0x10000) != 0) {
    pTab->tabFlags = pTab->tabFlags | 0x10000;
    for (local_7c = 0; local_7c < pTab->nCol; local_7c = local_7c + 1) {
      pCVar5 = pTab->aCol + local_7c;
      if ((byte)pCVar5->field_0x8 >> 4 == 0) {
        if ((pCVar5->colFlags & 4) == 0) {
          sqlite3ErrorMsg(in_RDI,"missing datatype for %s.%s",pTab->zName,pCVar5->zCnName);
        }
        else {
          pcVar9 = pTab->zName;
          pcVar10 = pCVar5->zCnName;
          pcVar6 = sqlite3ColumnType((Column *)
                                     CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                                     (char *)local_c8);
          sqlite3ErrorMsg(in_RDI,"unknown datatype for %s.%s: \"%s\"",pcVar9,pcVar10,pcVar6);
        }
        goto LAB_001add90;
      }
      if ((byte)pCVar5->field_0x8 >> 4 == 1) {
        pCVar5->affinity = 'A';
      }
      if ((((pCVar5->colFlags & 1) != 0) && (pTab->iPKey != local_7c)) &&
         ((pCVar5->field_0x8 & 0xf) == 0)) {
        pCVar5->field_0x8 = pCVar5->field_0x8 & 0xf0 | 2;
        pTab->tabFlags = pTab->tabFlags | 0x800;
      }
    }
  }
  if ((in_ECX & 0x80) != 0) {
    if ((pTab->tabFlags & 8) != 0) {
      sqlite3ErrorMsg(in_RDI,"AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      goto LAB_001add90;
    }
    if ((pTab->tabFlags & 4) == 0) {
      sqlite3ErrorMsg(in_RDI,"PRIMARY KEY missing on table %s",pTab->zName);
      goto LAB_001add90;
    }
    pTab->tabFlags = pTab->tabFlags | 0x280;
    convertToWithoutRowidTable(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  }
  iVar2 = sqlite3SchemaToIndex(db_00,pTab->pSchema);
  if ((pTab->pCheck != (ExprList *)0x0) &&
     (sqlite3ResolveSelfReference
                (in_stack_fffffffffffffea8,(Table *)in_stack_fffffffffffffea0,
                 in_stack_fffffffffffffe9c,(Expr *)local_c8,
                 (ExprList *)
                 CONCAT26(in_stack_fffffffffffffe8e,
                          CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))),
     in_RDI->nErr != 0)) {
    sqlite3ExprListDelete
              (local_c8,(ExprList *)
                        CONCAT26(in_stack_fffffffffffffe8e,
                                 CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)));
    pTab->pCheck = (ExprList *)0x0;
  }
  if ((pTab->tabFlags & 0x60) != 0) {
    local_90 = 0;
    for (local_8c = 0; local_8c < pTab->nCol; local_8c = local_8c + 1) {
      if ((pTab->aCol[local_8c].colFlags & 0x60) == 0) {
        local_90 = local_90 + 1;
      }
      else {
        sqlite3ColumnExpr(pTab,pTab->aCol + local_8c);
        iVar3 = sqlite3ResolveSelfReference
                          (in_stack_fffffffffffffea8,(Table *)in_stack_fffffffffffffea0,
                           in_stack_fffffffffffffe9c,(Expr *)local_c8,
                           (ExprList *)
                           CONCAT26(in_stack_fffffffffffffe8e,
                                    CONCAT24(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)));
        if (iVar3 != 0) {
          in_stack_fffffffffffffed0 = (Table *)(pTab->aCol + local_8c);
          in_stack_fffffffffffffec0 = in_RDI;
          in_stack_fffffffffffffec8 = pTab;
          sqlite3ExprAlloc((sqlite3 *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                           (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                           (Token *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
          sqlite3ColumnSetExpr
                    ((Parse *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (Table *)in_stack_fffffffffffffea8,(Column *)in_stack_fffffffffffffea0,
                     (Expr *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        }
      }
    }
    if (local_90 == 0) {
      sqlite3ErrorMsg(in_RDI,"must have at least one non-generated column");
      goto LAB_001add90;
    }
  }
  estimateTableWidth((Table *)in_stack_fffffffffffffea0);
  for (local_78 = pTab->pIndex; local_78 != (Index *)0x0; local_78 = local_78->pNext) {
    estimateIndexWidth((Index *)in_stack_fffffffffffffea0);
  }
  if ((db_00->init).busy == '\0') {
    p_00 = sqlite3GetVdbe((Parse *)CONCAT26(in_stack_fffffffffffffe8e,
                                            CONCAT24(in_stack_fffffffffffffe8c,
                                                     in_stack_fffffffffffffe88)));
    if (p_00 == (Vdbe *)0x0) goto LAB_001add90;
    sqlite3VdbeAddOp1((Vdbe *)local_c8,CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c)
                      ,in_stack_fffffffffffffe88);
    if (pTab->eTabType == '\0') {
      pcVar10 = "table";
      pcVar9 = "TABLE";
    }
    else {
      pcVar10 = "view";
      pcVar9 = "VIEW";
    }
    if (in_R8 != 0) {
      memset(&local_30,0xaa,0x28);
      if (in_RDI->eParseMode != '\0') {
        in_RDI->rc = 1;
        in_RDI->nErr = in_RDI->nErr + 1;
        goto LAB_001add90;
      }
      in_RDI->nTab = in_RDI->nTab + 1;
      iVar3 = in_RDI->nMem + 1;
      in_RDI->nMem = iVar3;
      in_RDI->nMem = in_RDI->nMem + 1;
      in_RDI->nMem = in_RDI->nMem + 1;
      sqlite3MayAbort(in_RDI);
      sqlite3VdbeAddOp3((Vdbe *)in_stack_fffffffffffffea8,
                        (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                        (int)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                        in_stack_fffffffffffffe98);
      sqlite3VdbeChangeP5(p_00,0x10);
      sqlite3VdbeCurrentAddr(p_00);
      sqlite3VdbeAddOp3((Vdbe *)in_stack_fffffffffffffea8,
                        (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                        (int)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                        in_stack_fffffffffffffe98);
      if ((in_RDI->nErr != 0) ||
         (pTVar7 = sqlite3ResultSetOfSelect
                             (in_stack_fffffffffffffea8,(Select *)in_stack_fffffffffffffea0,
                              (char)((uint)in_stack_fffffffffffffe9c >> 0x18)),
         pTVar7 == (Table *)0x0)) goto LAB_001add90;
      iVar1 = pTVar7->nCol;
      pTab->nNVCol = iVar1;
      pTab->nCol = iVar1;
      pTab->aCol = pTVar7->aCol;
      pTVar7->nCol = 0;
      pTVar7->aCol = (Column *)0x0;
      sqlite3DeleteTable(local_c8,(Table *)CONCAT26(in_stack_fffffffffffffe8e,
                                                    CONCAT24(in_stack_fffffffffffffe8c,
                                                             in_stack_fffffffffffffe88)));
      sqlite3SelectDestInit(&local_30,0xd,iVar3);
      sqlite3Select((Parse *)pEnd,(Select *)CONCAT44(tabOpts,in_stack_00000128),
                    (SelectDest *)pSelect);
      if (in_RDI->nErr != 0) goto LAB_001add90;
      sqlite3VdbeEndCoroutine
                ((Vdbe *)local_c8,CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c));
      sqlite3VdbeJumpHere((Vdbe *)local_c8,
                          CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c));
      sqlite3VdbeAddOp1((Vdbe *)local_c8,
                        CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c),
                        in_stack_fffffffffffffe88);
      sqlite3VdbeAddOp3((Vdbe *)in_stack_fffffffffffffea8,
                        (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                        (int)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                        in_stack_fffffffffffffe98);
      sqlite3TableAffinity
                ((Vdbe *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                 (Table *)in_stack_fffffffffffffea8,(int)((ulong)in_stack_fffffffffffffea0 >> 0x20))
      ;
      sqlite3VdbeAddOp2((Vdbe *)local_c8,
                        CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c),
                        in_stack_fffffffffffffe88,0);
      sqlite3VdbeAddOp3((Vdbe *)in_stack_fffffffffffffea8,
                        (int)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                        (int)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                        in_stack_fffffffffffffe98);
      sqlite3VdbeGoto((Vdbe *)local_c8,CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c)
                     );
      sqlite3VdbeJumpHere((Vdbe *)local_c8,
                          CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c));
      sqlite3VdbeAddOp1((Vdbe *)local_c8,
                        CONCAT22(in_stack_fffffffffffffe8e,in_stack_fffffffffffffe8c),
                        in_stack_fffffffffffffe88);
    }
    if (in_R8 == 0) {
      in_stack_fffffffffffffeb8 = in_RDX;
      if (in_ECX != 0) {
        in_stack_fffffffffffffeb8 = &in_RDI->sLastToken;
      }
      uVar4 = (int)in_stack_fffffffffffffeb8->z - (int)(in_RDI->sNameToken).z;
      if (*in_stack_fffffffffffffeb8->z != ';') {
        uVar4 = in_stack_fffffffffffffeb8->n + uVar4;
      }
      local_c8 = (sqlite3 *)
                 sqlite3MPrintf(db_00,"CREATE %s %.*s",pcVar9,(ulong)uVar4,(in_RDI->sNameToken).z);
    }
    else {
      local_c8 = (sqlite3 *)createTableStmt(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
    }
    iVar3 = in_RDI->regRoot;
    p1 = in_RDI->regRowid;
    sqlite3NestedParse(in_RDI,
                       "UPDATE %Q.sqlite_master SET type=\'%s\', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q WHERE rowid=#%d"
                       ,db_00->aDb[iVar2].zDbSName,pcVar10,pTab->zName,pTab->zName);
    sqlite3DbFree(local_c8,(void *)CONCAT26(in_stack_fffffffffffffe8e,
                                            CONCAT24(in_stack_fffffffffffffe8c,iVar3)));
    sqlite3ChangeCookie(in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
    if ((((pTab->tabFlags & 8) != 0) && (in_RDI->eParseMode == '\0')) &&
       ((db_00->aDb[iVar2].pSchema)->pSeqTab == (Table *)0x0)) {
      sqlite3NestedParse(in_RDI,"CREATE TABLE %Q.sqlite_sequence(name,seq)",
                         db_00->aDb[iVar2].zDbSName);
    }
    sqlite3MPrintf(db_00,"tbl_name=\'%q\' AND type!=\'trigger\'",pTab->zName);
    sqlite3VdbeAddParseSchemaOp
              ((Vdbe *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,(char *)local_c8,
               in_stack_fffffffffffffe8e);
    if ((pTab->tabFlags & 0x60) != 0) {
      sqlite3MPrintf(db_00,"SELECT*FROM\"%w\".\"%w\"",db_00->aDb[iVar2].zDbSName,pTab->zName);
      sqlite3VdbeAddOp4(p_00,in_stack_fffffffffffffe9c,p1,(int)((ulong)local_c8 >> 0x20),
                        (int)local_c8,
                        (char *)CONCAT26(in_stack_fffffffffffffe8e,
                                         CONCAT24(in_stack_fffffffffffffe8c,0xfffffffa)),
                        in_stack_fffffffffffffeb0);
    }
  }
  if ((db_00->init).busy != '\0') {
    pvVar8 = sqlite3HashInsert((Hash *)in_stack_fffffffffffffec8,(char *)in_stack_fffffffffffffec0,
                               in_stack_fffffffffffffeb8);
    if (pvVar8 != (void *)0x0) {
      sqlite3OomFault(local_c8);
      goto LAB_001add90;
    }
    in_RDI->pNewTable = (Table *)0x0;
    db_00->mDbFlags = db_00->mDbFlags | 1;
    iVar2 = strcmp(pTab->zName,"sqlite_sequence");
    if (iVar2 == 0) {
      pTab->pSchema->pSeqTab = pTab;
    }
  }
  if ((in_R8 == 0) && (pTab->eTabType == '\0')) {
    local_40 = in_RSI;
    if (in_RSI->z == (char *)0x0) {
      local_40 = in_RDX;
    }
    (pTab->u).tab.addColOffset = ((int)local_40->z - (int)(in_RDI->sNameToken).z) + 0xd;
  }
LAB_001add90:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3EndTable(
  Parse *pParse,          /* Parse context */
  Token *pCons,           /* The ',' token after the last column defn. */
  Token *pEnd,            /* The ')' before options in the CREATE TABLE */
  u32 tabOpts,            /* Extra table options. Usually 0. */
  Select *pSelect         /* Select from a "CREATE ... AS SELECT" */
){
  Table *p;                 /* The new table */
  sqlite3 *db = pParse->db; /* The database connection */
  int iDb;                  /* Database in which the table lives */
  Index *pIdx;              /* An implied index of the table */

  if( pEnd==0 && pSelect==0 ){
    return;
  }
  p = pParse->pNewTable;
  if( p==0 ) return;

  if( pSelect==0 && sqlite3ShadowTableName(db, p->zName) ){
    p->tabFlags |= TF_Shadow;
  }

  /* If the db->init.busy is 1 it means we are reading the SQL off the
  ** "sqlite_schema" or "sqlite_temp_schema" table on the disk.
  ** So do not write to the disk again.  Extract the root page number
  ** for the table from the db->init.newTnum field.  (The page number
  ** should have been put there by the sqliteOpenCb routine.)
  **
  ** If the root page number is 1, that means this is the sqlite_schema
  ** table itself.  So mark it read-only.
  */
  if( db->init.busy ){
    if( pSelect || (!IsOrdinaryTable(p) && db->init.newTnum) ){
      sqlite3ErrorMsg(pParse, "");
      return;
    }
    p->tnum = db->init.newTnum;
    if( p->tnum==1 ) p->tabFlags |= TF_Readonly;
  }

  /* Special processing for tables that include the STRICT keyword:
  **
  **   *  Do not allow custom column datatypes.  Every column must have
  **      a datatype that is one of INT, INTEGER, REAL, TEXT, or BLOB.
  **
  **   *  If a PRIMARY KEY is defined, other than the INTEGER PRIMARY KEY,
  **      then all columns of the PRIMARY KEY must have a NOT NULL
  **      constraint.
  */
  if( tabOpts & TF_Strict ){
    int ii;
    p->tabFlags |= TF_Strict;
    for(ii=0; ii<p->nCol; ii++){
      Column *pCol = &p->aCol[ii];
      if( pCol->eCType==COLTYPE_CUSTOM ){
        if( pCol->colFlags & COLFLAG_HASTYPE ){
          sqlite3ErrorMsg(pParse,
            "unknown datatype for %s.%s: \"%s\"",
            p->zName, pCol->zCnName, sqlite3ColumnType(pCol, "")
          );
        }else{
          sqlite3ErrorMsg(pParse, "missing datatype for %s.%s",
                          p->zName, pCol->zCnName);
        }
        return;
      }else if( pCol->eCType==COLTYPE_ANY ){
        pCol->affinity = SQLITE_AFF_BLOB;
      }
      if( (pCol->colFlags & COLFLAG_PRIMKEY)!=0
       && p->iPKey!=ii
       && pCol->notNull == OE_None
      ){
        pCol->notNull = OE_Abort;
        p->tabFlags |= TF_HasNotNull;
      }
    }
  }

  assert( (p->tabFlags & TF_HasPrimaryKey)==0
       || p->iPKey>=0 || sqlite3PrimaryKeyIndex(p)!=0 );
  assert( (p->tabFlags & TF_HasPrimaryKey)!=0
       || (p->iPKey<0 && sqlite3PrimaryKeyIndex(p)==0) );

  /* Special processing for WITHOUT ROWID Tables */
  if( tabOpts & TF_WithoutRowid ){
    if( (p->tabFlags & TF_Autoincrement) ){
      sqlite3ErrorMsg(pParse,
          "AUTOINCREMENT not allowed on WITHOUT ROWID tables");
      return;
    }
    if( (p->tabFlags & TF_HasPrimaryKey)==0 ){
      sqlite3ErrorMsg(pParse, "PRIMARY KEY missing on table %s", p->zName);
      return;
    }
    p->tabFlags |= TF_WithoutRowid | TF_NoVisibleRowid;
    convertToWithoutRowidTable(pParse, p);
  }
  iDb = sqlite3SchemaToIndex(db, p->pSchema);

#ifndef SQLITE_OMIT_CHECK
  /* Resolve names in all CHECK constraint expressions.
  */
  if( p->pCheck ){
    sqlite3ResolveSelfReference(pParse, p, NC_IsCheck, 0, p->pCheck);
    if( pParse->nErr ){
      /* If errors are seen, delete the CHECK constraints now, else they might
      ** actually be used if PRAGMA writable_schema=ON is set. */
      sqlite3ExprListDelete(db, p->pCheck);
      p->pCheck = 0;
    }else{
      markExprListImmutable(p->pCheck);
    }
  }
#endif /* !defined(SQLITE_OMIT_CHECK) */
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  if( p->tabFlags & TF_HasGenerated ){
    int ii, nNG = 0;
    testcase( p->tabFlags & TF_HasVirtual );
    testcase( p->tabFlags & TF_HasStored );
    for(ii=0; ii<p->nCol; ii++){
      u32 colFlags = p->aCol[ii].colFlags;
      if( (colFlags & COLFLAG_GENERATED)!=0 ){
        Expr *pX = sqlite3ColumnExpr(p, &p->aCol[ii]);
        testcase( colFlags & COLFLAG_VIRTUAL );
        testcase( colFlags & COLFLAG_STORED );
        if( sqlite3ResolveSelfReference(pParse, p, NC_GenCol, pX, 0) ){
          /* If there are errors in resolving the expression, change the
          ** expression to a NULL.  This prevents code generators that operate
          ** on the expression from inserting extra parts into the expression
          ** tree that have been allocated from lookaside memory, which is
          ** illegal in a schema and will lead to errors or heap corruption
          ** when the database connection closes. */
          sqlite3ColumnSetExpr(pParse, p, &p->aCol[ii],
               sqlite3ExprAlloc(db, TK_NULL, 0, 0));
        }
      }else{
        nNG++;
      }
    }
    if( nNG==0 ){
      sqlite3ErrorMsg(pParse, "must have at least one non-generated column");
      return;
    }
  }
#endif

  /* Estimate the average row size for the table and for all implied indices */
  estimateTableWidth(p);
  for(pIdx=p->pIndex; pIdx; pIdx=pIdx->pNext){
    estimateIndexWidth(pIdx);
  }

  /* If not initializing, then create a record for the new table
  ** in the schema table of the database.
  **
  ** If this is a TEMPORARY table, write the entry into the auxiliary
  ** file instead of into the main database file.
  */
  if( !db->init.busy ){
    int n;
    Vdbe *v;
    char *zType;    /* "view" or "table" */
    char *zType2;   /* "VIEW" or "TABLE" */
    char *zStmt;    /* Text of the CREATE TABLE or CREATE VIEW statement */

    v = sqlite3GetVdbe(pParse);
    if( NEVER(v==0) ) return;

    sqlite3VdbeAddOp1(v, OP_Close, 0);

    /*
    ** Initialize zType for the new view or table.
    */
    if( IsOrdinaryTable(p) ){
      /* A regular table */
      zType = "table";
      zType2 = "TABLE";
#ifndef SQLITE_OMIT_VIEW
    }else{
      /* A view */
      zType = "view";
      zType2 = "VIEW";
#endif
    }

    /* If this is a CREATE TABLE xx AS SELECT ..., execute the SELECT
    ** statement to populate the new table. The root-page number for the
    ** new table is in register pParse->regRoot.
    **
    ** Once the SELECT has been coded by sqlite3Select(), it is in a
    ** suitable state to query for the column names and types to be used
    ** by the new table.
    **
    ** A shared-cache write-lock is not required to write to the new table,
    ** as a schema-lock must have already been obtained to create it. Since
    ** a schema-lock excludes all other database users, the write-lock would
    ** be redundant.
    */
    if( pSelect ){
      SelectDest dest;    /* Where the SELECT should store results */
      int regYield;       /* Register holding co-routine entry-point */
      int addrTop;        /* Top of the co-routine */
      int regRec;         /* A record to be insert into the new table */
      int regRowid;       /* Rowid of the next row to insert */
      int addrInsLoop;    /* Top of the loop for inserting rows */
      Table *pSelTab;     /* A table that describes the SELECT results */
      int iCsr;           /* Write cursor on the new table */

      if( IN_SPECIAL_PARSE ){
        pParse->rc = SQLITE_ERROR;
        pParse->nErr++;
        return;
      }
      iCsr = pParse->nTab++;
      regYield = ++pParse->nMem;
      regRec = ++pParse->nMem;
      regRowid = ++pParse->nMem;
      sqlite3MayAbort(pParse);
      sqlite3VdbeAddOp3(v, OP_OpenWrite, iCsr, pParse->regRoot, iDb);
      sqlite3VdbeChangeP5(v, OPFLAG_P2ISREG);
      addrTop = sqlite3VdbeCurrentAddr(v) + 1;
      sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, addrTop);
      if( pParse->nErr ) return;
      pSelTab = sqlite3ResultSetOfSelect(pParse, pSelect, SQLITE_AFF_BLOB);
      if( pSelTab==0 ) return;
      assert( p->aCol==0 );
      p->nCol = p->nNVCol = pSelTab->nCol;
      p->aCol = pSelTab->aCol;
      pSelTab->nCol = 0;
      pSelTab->aCol = 0;
      sqlite3DeleteTable(db, pSelTab);
      sqlite3SelectDestInit(&dest, SRT_Coroutine, regYield);
      sqlite3Select(pParse, pSelect, &dest);
      if( pParse->nErr ) return;
      sqlite3VdbeEndCoroutine(v, regYield);
      sqlite3VdbeJumpHere(v, addrTop - 1);
      addrInsLoop = sqlite3VdbeAddOp1(v, OP_Yield, dest.iSDParm);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_MakeRecord, dest.iSdst, dest.nSdst, regRec);
      sqlite3TableAffinity(v, p, 0);
      sqlite3VdbeAddOp2(v, OP_NewRowid, iCsr, regRowid);
      sqlite3VdbeAddOp3(v, OP_Insert, iCsr, regRec, regRowid);
      sqlite3VdbeGoto(v, addrInsLoop);
      sqlite3VdbeJumpHere(v, addrInsLoop);
      sqlite3VdbeAddOp1(v, OP_Close, iCsr);
    }

    /* Compute the complete text of the CREATE statement */
    if( pSelect ){
      zStmt = createTableStmt(db, p);
    }else{
      Token *pEnd2 = tabOpts ? &pParse->sLastToken : pEnd;
      n = (int)(pEnd2->z - pParse->sNameToken.z);
      if( pEnd2->z[0]!=';' ) n += pEnd2->n;
      zStmt = sqlite3MPrintf(db,
          "CREATE %s %.*s", zType2, n, pParse->sNameToken.z
      );
    }

    /* A slot for the record has already been allocated in the
    ** schema table.  We just need to update that slot with all
    ** the information we've collected.
    */
    sqlite3NestedParse(pParse,
      "UPDATE %Q." LEGACY_SCHEMA_TABLE
      " SET type='%s', name=%Q, tbl_name=%Q, rootpage=#%d, sql=%Q"
      " WHERE rowid=#%d",
      db->aDb[iDb].zDbSName,
      zType,
      p->zName,
      p->zName,
      pParse->regRoot,
      zStmt,
      pParse->regRowid
    );
    sqlite3DbFree(db, zStmt);
    sqlite3ChangeCookie(pParse, iDb);

#ifndef SQLITE_OMIT_AUTOINCREMENT
    /* Check to see if we need to create an sqlite_sequence table for
    ** keeping track of autoincrement keys.
    */
    if( (p->tabFlags & TF_Autoincrement)!=0 && !IN_SPECIAL_PARSE ){
      Db *pDb = &db->aDb[iDb];
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      if( pDb->pSchema->pSeqTab==0 ){
        sqlite3NestedParse(pParse,
          "CREATE TABLE %Q.sqlite_sequence(name,seq)",
          pDb->zDbSName
        );
      }
    }
#endif

    /* Reparse everything to update our internal data structures */
    sqlite3VdbeAddParseSchemaOp(v, iDb,
           sqlite3MPrintf(db, "tbl_name='%q' AND type!='trigger'", p->zName),0);

    /* Test for cycles in generated columns and illegal expressions
    ** in CHECK constraints and in DEFAULT clauses. */
    if( p->tabFlags & TF_HasGenerated ){
      sqlite3VdbeAddOp4(v, OP_SqlExec, 0x0001, 0, 0,
             sqlite3MPrintf(db, "SELECT*FROM\"%w\".\"%w\"",
                   db->aDb[iDb].zDbSName, p->zName), P4_DYNAMIC);
    }
  }

  /* Add the table to the in-memory representation of the database.
  */
  if( db->init.busy ){
    Table *pOld;
    Schema *pSchema = p->pSchema;
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    assert( HasRowid(p) || p->iPKey<0 );
    pOld = sqlite3HashInsert(&pSchema->tblHash, p->zName, p);
    if( pOld ){
      assert( p==pOld );  /* Malloc must have failed inside HashInsert() */
      sqlite3OomFault(db);
      return;
    }
    pParse->pNewTable = 0;
    db->mDbFlags |= DBFLAG_SchemaChange;

    /* If this is the magic sqlite_sequence table used by autoincrement,
    ** then record a pointer to this table in the main database structure
    ** so that INSERT can find the table easily.  */
    assert( !pParse->nested );
#ifndef SQLITE_OMIT_AUTOINCREMENT
    if( strcmp(p->zName, "sqlite_sequence")==0 ){
      assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
      p->pSchema->pSeqTab = p;
    }
#endif
  }

#ifndef SQLITE_OMIT_ALTERTABLE
  if( !pSelect && IsOrdinaryTable(p) ){
    assert( pCons && pEnd );
    if( pCons->z==0 ){
      pCons = pEnd;
    }
    p->u.tab.addColOffset = 13 + (int)(pCons->z - pParse->sNameToken.z);
  }
#endif
}